

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

bool __thiscall ON_PolyEdgeSegment::ReversedTrimDir(ON_PolyEdgeSegment *this)

{
  bool bVar1;
  byte bVar2;
  
  bVar2 = 0;
  if ((this->m_trim != (ON_BrepTrim *)0x0) && (this->m_edge != (ON_BrepEdge *)0x0)) {
    bVar1 = ReversedEdgeDir(this);
    bVar2 = bVar1 ^ this->m_trim->m_bRev3d;
  }
  return (bool)bVar2;
}

Assistant:

bool ON_PolyEdgeSegment::ReversedTrimDir() const
{
  bool rc = false;
  if ( m_trim && m_edge )
  {
    rc = ReversedEdgeDir();
    if ( m_trim->m_bRev3d )
      rc = !rc;
  }
  return rc;
}